

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coalesce.c
# Opt level: O0

int inform_coalesce(int *series,size_t n,int *coal,inform_error *err)

{
  undefined4 *__dest;
  undefined4 *__ptr;
  void *pvVar1;
  int *x;
  size_t i_2;
  size_t j;
  size_t i_1;
  int *map;
  size_t i;
  int b;
  int *tmp;
  inform_error *err_local;
  int *coal_local;
  size_t n_local;
  int *series_local;
  
  if (series == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._4_4_ = 0;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local._4_4_ = 0;
  }
  else if (coal == (int *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local._4_4_ = 0;
  }
  else {
    __dest = (undefined4 *)malloc(n << 2);
    if (__dest == (undefined4 *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local._4_4_ = 0;
    }
    else {
      memcpy(__dest,series,n << 2);
      qsort(__dest,n,4,compare_ints);
      i._4_4_ = 1;
      for (map = (int *)0x1; map < n; map = (int *)((long)map + 1)) {
        if (__dest[(long)map] != __dest[(long)map + -1]) {
          i._4_4_ = i._4_4_ + 1;
        }
      }
      __ptr = (undefined4 *)malloc((long)i._4_4_ << 2);
      if (__ptr == (undefined4 *)0x0) {
        free(__dest);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        series_local._4_4_ = 0;
      }
      else {
        *__ptr = *__dest;
        i_2 = 1;
        for (j = 1; j < n; j = j + 1) {
          if (__dest[j] != __dest[j - 1]) {
            __ptr[i_2] = __dest[j];
            i_2 = i_2 + 1;
          }
        }
        free(__dest);
        for (x = (int *)0x0; x < n; x = (int *)((long)x + 1)) {
          pvVar1 = bsearch(series + (long)x,__ptr,(long)i._4_4_,4,compare_ints);
          if (pvVar1 == (void *)0x0) {
            free(__ptr);
            if (err != (inform_error *)0x0) {
              *err = INFORM_EBIN;
            }
            return 0;
          }
          coal[(long)x] = (int)((long)pvVar1 - (long)__ptr >> 2);
        }
        free(__ptr);
        series_local._4_4_ = i._4_4_;
      }
    }
  }
  return series_local._4_4_;
}

Assistant:

int inform_coalesce(int const *series, size_t n, int *coal, inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0);
    else if (coal == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0);

    int *tmp = malloc(n * sizeof(int));
    if (tmp == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    memcpy(tmp, series, n * sizeof(int));
    qsort(tmp, n, sizeof(int), compare_ints);
    int b = 1;
    for (size_t i = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) ++b;
    }

    int *map = malloc(b * sizeof(int));
    if (map == NULL)
    {
        free(tmp);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, 0);
    }
    map[0] = tmp[0];
    for (size_t i = 1, j = 1; i < n; ++i)
    {
        if (tmp[i] != tmp[i-1]) map[j++] = tmp[i];
    }
    free(tmp);

    for (size_t i = 0; i < n; ++i)
    {
        int *x = bsearch(series + i, map, b, sizeof(int), compare_ints);
        if (x == NULL)
        {
            free(map);
            INFORM_ERROR_RETURN(err, INFORM_EBIN, 0);
        }
        coal[i] = (int) (x - map);
    }

    free(map);
    return b;
}